

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O2

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  char zero [256];
  
  memset(zero,0,0x100);
  iVar1 = random_cb_called;
  eval_a = (int64_t)status;
  eval_b = 0;
  if (eval_a == 0) {
    if ((char *)buf != scratch) {
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar3 = "buf";
      uVar6 = 0x25;
      pcVar4 = "==";
      pcVar5 = "(void*) scratch";
      eval_a = (int64_t)buf;
      eval_b = (int64_t)scratch;
      goto LAB_0016b72a;
    }
    eval_a = buflen;
    if (random_cb_called == 0) {
      eval_b = 0;
      if (buflen == 0) {
        iVar2 = memcmp(scratch,zero,0x100);
        eval_a = (int64_t)iVar2;
        eval_b = 0;
        if (eval_a == 0) goto LAB_0016b605;
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "memcmp(scratch, zero, sizeof(zero))";
        uVar6 = 0x29;
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "buflen";
        uVar6 = 0x28;
      }
    }
    else {
      eval_b = 0x100;
      if (buflen == 0x100) {
        eval_a = 0;
        iVar2 = memcmp(scratch,zero,0x100);
        if (iVar2 != 0) {
LAB_0016b605:
          random_cb_called = iVar1 + 1;
          return;
        }
        pcVar4 = "!=";
        pcVar5 = "memcmp(scratch, zero, sizeof(zero))";
        pcVar3 = "0";
        uVar6 = 0x2d;
        eval_b = 0;
      }
      else {
        pcVar4 = "==";
        pcVar5 = "sizeof(scratch)";
        pcVar3 = "buflen";
        uVar6 = 0x2b;
      }
    }
  }
  else {
    pcVar4 = "==";
    pcVar5 = "0";
    pcVar3 = "status";
    uVar6 = 0x24;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0016b72a:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-random.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT_OK(status);
  ASSERT_PTR_EQ(buf, (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT_OK(buflen);
    ASSERT_OK(memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT_EQ(buflen, sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT_NE(0, memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}